

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbaReadVer.c
# Opt level: O1

int Prs_CreateVerilogNtk(Cba_Ntk_t *p,Prs_Ntk_t *pNtk)

{
  ulong uVar1;
  Cba_Man_t *pCVar2;
  void *__ptr;
  int *piVar3;
  char *pcVar4;
  int iVar5;
  uint uVar6;
  int iVar7;
  uint uVar8;
  uint uVar9;
  int iVar10;
  uint uVar11;
  uint i;
  uint uVar12;
  int iVar13;
  int iVar14;
  int *__ptr_00;
  char *pcVar15;
  size_t sVar16;
  Prs_VerInfo_t *pPVar17;
  int Fill;
  int Fill_00;
  int Fill_01;
  int Fill_02;
  int Fill_03;
  int Fill_04;
  int Fill_05;
  int Fill_06;
  int Fill_07;
  int Fill_08;
  int Fill_09;
  int Fill_10;
  int Fill_11;
  int extraout_EDX;
  int extraout_EDX_00;
  int Fill_12;
  int Fill_13;
  int Fill_14;
  int Fill_15;
  int Fill_16;
  long extraout_RDX;
  long extraout_RDX_00;
  long extraout_RDX_01;
  long lVar18;
  long extraout_RDX_02;
  long extraout_RDX_03;
  long extraout_RDX_04;
  Vec_Int_t *pVVar19;
  long extraout_RDX_05;
  long extraout_RDX_06;
  long extraout_RDX_07;
  long extraout_RDX_08;
  long extraout_RDX_09;
  long extraout_RDX_10;
  int *extraout_RDX_11;
  int *extraout_RDX_12;
  int *extraout_RDX_13;
  int *extraout_RDX_14;
  int *piVar20;
  int *extraout_RDX_15;
  int *extraout_RDX_16;
  int *extraout_RDX_17;
  Prs_Ntk_t *pNtk_00;
  int *extraout_RDX_18;
  int *extraout_RDX_19;
  int *extraout_RDX_20;
  int *extraout_RDX_21;
  int *extraout_RDX_22;
  int *extraout_RDX_23;
  Prs_Ntk_t *pNtk_01;
  undefined8 extraout_RDX_24;
  undefined8 extraout_RDX_25;
  undefined8 extraout_RDX_26;
  undefined8 extraout_RDX_27;
  undefined8 uVar21;
  ulong uVar22;
  Cba_ObjType_t CVar23;
  int iVar24;
  char cVar25;
  void *pvVar26;
  ulong uVar27;
  long lVar28;
  long lVar29;
  long lVar30;
  bool bVar31;
  int iBitRst;
  int iBitSet;
  int IndexRst;
  int IndexSet;
  char **local_b0;
  Cba_Man_t *local_98;
  uint local_58;
  int local_54;
  int local_50;
  int local_4c;
  Vec_Ptr_t *local_48;
  Vec_Int_t *local_40;
  Vec_Int_t *local_38;
  
  iVar10 = (pNtk->vObjs).nSize;
  __ptr_00 = (int *)malloc(0x10);
  iVar13 = 0x10;
  if (0xe < iVar10 - 1U) {
    iVar13 = iVar10;
  }
  __ptr_00[1] = 0;
  *__ptr_00 = iVar13;
  if (iVar13 == 0) {
    local_38 = (Vec_Int_t *)0x0;
    lVar18 = extraout_RDX;
  }
  else {
    local_38 = (Vec_Int_t *)malloc((long)iVar13 << 2);
    lVar18 = extraout_RDX_00;
  }
  *(Vec_Int_t **)(__ptr_00 + 2) = local_38;
  __ptr_00[1] = iVar10;
  if (local_38 != (Vec_Int_t *)0x0) {
    memset(local_38,0,(long)iVar10 << 2);
    lVar18 = extraout_RDX_01;
  }
  local_98 = p->pDesign;
  if (0 < (local_98->vUsed).nSize) {
    piVar20 = (local_98->vUsed).pArray;
    lVar18 = 0;
    do {
      iVar13 = piVar20[lVar18];
      if (((long)iVar13 < 0) || ((local_98->vNameMap).nSize <= iVar13)) goto LAB_003e6502;
      (local_98->vNameMap).pArray[iVar13] = 0;
      lVar18 = lVar18 + 1;
    } while (lVar18 < (local_98->vUsed).nSize);
  }
  (local_98->vUsed).nSize = 0;
  if (0 < (p->vInputs).nSize) {
    lVar28 = 0;
    do {
      iVar13 = (p->vInputs).pArray[lVar28];
      local_98 = (Cba_Man_t *)(long)iVar13;
      if ((long)local_98 < 1) goto LAB_003e6540;
      if ((p->vObjName).nSize < 1) goto LAB_003e6549;
      Vec_IntFillExtra(&p->vObjName,iVar13 + 1,(int)lVar18);
      if (((p->vObjName).nSize <= iVar13) || ((p->vObjFon0).nSize <= iVar13)) goto LAB_003e64e3;
      uVar6 = (p->vObjName).pArray[(long)local_98];
      pCVar2 = p->pDesign;
      iVar5 = (p->vObjFon0).pArray[(long)local_98];
      Vec_IntFillExtra(&pCVar2->vNameMap,uVar6 + 1,iVar13);
      if (((int)uVar6 < 0) || ((pCVar2->vNameMap).nSize <= (int)uVar6)) goto LAB_003e64e3;
      if ((pCVar2->vNameMap).pArray[uVar6] != 0) goto LAB_003e6568;
      Vec_IntFillExtra(&pCVar2->vNameMap,uVar6 + 1,Fill);
      if ((pCVar2->vNameMap).nSize <= (int)uVar6) goto LAB_003e6502;
      (pCVar2->vNameMap).pArray[uVar6] = iVar5;
      Vec_IntPush(&pCVar2->vUsed,uVar6);
      lVar28 = lVar28 + 1;
      lVar18 = extraout_RDX_02;
    } while (lVar28 < (p->vInputs).nSize);
  }
  if (0 < (pNtk->vWires).nSize) {
    lVar28 = 0;
    do {
      if ((pNtk->vWiresR).nSize <= lVar28) goto LAB_003e64e3;
      iVar13 = (pNtk->vWiresR).pArray[lVar28];
      uVar6 = (pNtk->vWires).pArray[lVar28];
      pCVar2 = p->pDesign;
      Vec_IntFillExtra(&pCVar2->vNameMap,uVar6 + 1,(int)lVar18);
      if (((int)uVar6 < 0) || ((pCVar2->vNameMap).nSize <= (int)uVar6)) goto LAB_003e64e3;
      if ((pCVar2->vNameMap).pArray[uVar6] != 0) goto LAB_003e6568;
      Vec_IntFillExtra(&pCVar2->vNameMap,uVar6 + 1,Fill_00);
      if ((pCVar2->vNameMap).nSize <= (int)uVar6) goto LAB_003e6502;
      (pCVar2->vNameMap).pArray[uVar6] = -iVar13;
      Vec_IntPush(&pCVar2->vUsed,uVar6);
      lVar28 = lVar28 + 1;
      lVar18 = extraout_RDX_03;
    } while (lVar28 < (pNtk->vWires).nSize);
  }
  if (0 < (pNtk->vOutputs).nSize) {
    lVar28 = 0;
    do {
      if ((pNtk->vOutputsR).nSize <= lVar28) goto LAB_003e64e3;
      iVar13 = (pNtk->vOutputsR).pArray[lVar28];
      uVar6 = (pNtk->vOutputs).pArray[lVar28];
      pCVar2 = p->pDesign;
      Vec_IntFillExtra(&pCVar2->vNameMap,uVar6 + 1,(int)lVar18);
      if (((int)uVar6 < 0) || ((pCVar2->vNameMap).nSize <= (int)uVar6)) goto LAB_003e64e3;
      if ((pCVar2->vNameMap).pArray[uVar6] != 0) {
LAB_003e6568:
        __assert_fail("Vec_IntGetEntry(&p->vNameMap, i) == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/cba/cba.h"
                      ,0x30e,"void Cba_ManSetMap(Cba_Man_t *, int, int)");
      }
      Vec_IntFillExtra(&pCVar2->vNameMap,uVar6 + 1,Fill_01);
      if ((pCVar2->vNameMap).nSize <= (int)uVar6) goto LAB_003e6502;
      (pCVar2->vNameMap).pArray[uVar6] = -iVar13;
      Vec_IntPush(&pCVar2->vUsed,uVar6);
      lVar28 = lVar28 + 1;
      lVar18 = extraout_RDX_04;
    } while (lVar28 < (pNtk->vOutputs).nSize);
  }
  local_48 = Prs_CreateDetectRams(pNtk);
  if ((local_48 != (Vec_Ptr_t *)0x0) && (0 < local_48->nSize)) {
    pVVar19 = (Vec_Int_t *)0x0;
    do {
      pvVar26 = local_48->pArray[(long)pVVar19];
      if ((*(int *)((long)pvVar26 + 4) < 1) ||
         (local_40 = pVVar19, *(int *)((long)pvVar26 + 4) == 1)) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      pcVar15 = (char *)**(undefined8 **)((long)pvVar26 + 8);
      iVar13 = *(int *)(*(undefined8 **)((long)pvVar26 + 8) + 1);
      iVar5 = Cba_NtkNewStrId(p,"%s_box");
      uVar6 = Cba_ObjAlloc(p,CBA_BOX_RAMBOX,*(int *)((long)pvVar26 + 4) + -2,1);
      local_98 = (Cba_Man_t *)(ulong)uVar6;
      Cba_ObjSetName(p,uVar6,iVar5);
      if ((int)uVar6 < 1) goto LAB_003e6587;
      if ((p->vObjFon0).nSize <= (int)uVar6) goto LAB_003e64e3;
      iVar5 = (p->vObjFon0).pArray[uVar6];
      iVar7 = Cba_NtkNewStrId(p,pcVar15);
      Cba_FonSetName(p,iVar5,iVar7);
      Prs_CreateRange(p,iVar5,iVar7);
      iVar7 = Cba_FonLeft(p,iVar5);
      if (iVar13 <= iVar7) {
        __assert_fail("Cba_FonLeft(p, iFon) <= MemSize-1",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/cba/cbaReadVer.c"
                      ,0x737,"int Prs_CreateVerilogNtk(Cba_Ntk_t *, Prs_Ntk_t *)");
      }
      iVar5 = Cba_FonRight(p,iVar5);
      if (iVar5 != 0) {
        __assert_fail("Cba_FonRight(p, iFon) == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/cba/cbaReadVer.c"
                      ,0x738,"int Prs_CreateVerilogNtk(Cba_Ntk_t *, Prs_Ntk_t *)");
      }
      if (2 < *(int *)((long)pvVar26 + 4)) {
        uVar22 = 0;
        do {
          __ptr = *(void **)(*(long *)((long)pvVar26 + 8) + 0x10 + uVar22 * 8);
          uVar8 = Cba_ObjAlloc(p,CBA_BOX_RAMWC,4,1);
          if (*(int *)((long)__ptr + 4) < 1) {
            __assert_fail("p->nSize > 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                          ,0x3bc,"int Vec_IntPop(Vec_Int_t *)");
          }
          uVar9 = *(int *)((long)__ptr + 4) - 1;
          *(uint *)((long)__ptr + 4) = uVar9;
          iVar5 = *(int *)(*(long *)((long)__ptr + 8) + (ulong)uVar9 * 4);
          lVar18 = (long)iVar5;
          if ((lVar18 < 0) || (iVar10 <= iVar5)) goto LAB_003e6502;
          (&local_38->nCap)[lVar18] = uVar8;
          if (((pNtk->vObjs).nSize <= iVar5) ||
             ((iVar5 = (pNtk->vObjs).pArray[lVar18], iVar5 < -2 ||
              (uVar9 = iVar5 + 2, (pNtk->vBoxes).nSize <= (int)uVar9)))) goto LAB_003e64e3;
          iVar5 = (pNtk->vBoxes).pArray[uVar9];
          if (iVar5 != 0) {
            Cba_ObjSetName(p,uVar8,iVar5);
          }
          if ((int)uVar8 < 1) goto LAB_003e6587;
          if ((p->vObjFon0).nSize <= (int)uVar8) goto LAB_003e64e3;
          piVar20 = (p->vObjFon0).pArray;
          uVar8 = piVar20[uVar8];
          iVar5 = Hash_Int2ManInsert(p->pDesign->vHash,iVar13 + -1,0,(int)piVar20);
          if ((p->vFonRange).nSize < 1) goto LAB_003e65c5;
          if (iVar5 < 0) goto LAB_003e65e4;
          Vec_IntFillExtra(&p->vFonRange,uVar8 + 1,Fill_02);
          if (((int)uVar8 < 0) || ((p->vFonRange).nSize <= (int)uVar8)) goto LAB_003e6502;
          (p->vFonRange).pArray[uVar8] = iVar5 * 2;
          uVar9 = Cba_NtkNewStrId(p,"%s_wp%d",pcVar15,uVar22 & 0xffffffff);
          Cba_FonSetName(p,uVar8,uVar9);
          pCVar2 = p->pDesign;
          Vec_IntFillExtra(&pCVar2->vNameMap,uVar9 + 1,Fill_03);
          if (((int)uVar9 < 0) || ((pCVar2->vNameMap).nSize <= (int)uVar9)) goto LAB_003e64e3;
          if ((pCVar2->vNameMap).pArray[uVar9] != 0) goto LAB_003e6568;
          Vec_IntFillExtra(&pCVar2->vNameMap,uVar9 + 1,Fill_04);
          if ((pCVar2->vNameMap).nSize <= (int)uVar9) goto LAB_003e6502;
          (pCVar2->vNameMap).pArray[uVar9] = uVar8;
          Vec_IntPush(&pCVar2->vUsed,uVar9);
          iVar5 = (int)uVar22;
          Cba_ObjSetFinFon(p,uVar6,iVar5,uVar8);
          if (*(void **)((long)__ptr + 8) != (void *)0x0) {
            free(*(void **)((long)__ptr + 8));
            *(undefined8 *)((long)__ptr + 8) = 0;
          }
          if (__ptr != (void *)0x0) {
            free(__ptr);
          }
          uVar22 = uVar22 + 2;
        } while (iVar5 + 4 < *(int *)((long)pvVar26 + 4));
      }
      if (*(void **)((long)pvVar26 + 8) != (void *)0x0) {
        free(*(void **)((long)pvVar26 + 8));
        *(undefined8 *)((long)pvVar26 + 8) = 0;
      }
      if (pvVar26 != (void *)0x0) {
        free(pvVar26);
      }
      pVVar19 = (Vec_Int_t *)((long)&local_40->nCap + 1);
    } while ((long)pVVar19 < (long)local_48->nSize);
  }
  if (local_48 != (Vec_Ptr_t *)0x0) {
    if (local_48->pArray != (void **)0x0) {
      free(local_48->pArray);
      local_48->pArray = (void **)0x0;
    }
    free(local_48);
  }
  (p->vArray0).nSize = 0;
  if (0 < (pNtk->vObjs).nSize) {
    lVar18 = 0;
    do {
      piVar20 = (pNtk->vObjs).pArray;
      iVar10 = piVar20[lVar18];
      if (((long)iVar10 < 0) || (iVar13 = (pNtk->vBoxes).nSize, iVar13 <= iVar10))
      goto LAB_003e64e3;
      piVar3 = (pNtk->vBoxes).pArray;
      Prs_BoxSignals_V._0_4_ = piVar3[iVar10] + -2;
      iVar10 = piVar20[lVar18];
      Prs_BoxSignals_V._4_4_ = Prs_BoxSignals_V._0_4_;
      if (((long)iVar10 < -3) || (iVar13 <= (int)(iVar10 + 3U))) goto LAB_003e6660;
      Prs_BoxSignals_V._8_8_ = piVar3 + (iVar10 + 3U);
      if (*(int *)Prs_BoxSignals_V._8_8_ == 0) {
        if ((iVar10 < -1) || (iVar10 < 0)) goto LAB_003e64e3;
        uVar6 = Cba_ObjAlloc(p,piVar3[iVar10 + 1U],
                             ((piVar3[iVar10] - (piVar3[iVar10] + -2 >> 0x1f)) + -2 >> 1) + -1,
                             (piVar3[iVar10 + 1U] == CBA_BOX_ADD) + 1);
        local_98 = (Cba_Man_t *)(ulong)uVar6;
        if ((int)uVar6 < 1) goto LAB_003e6587;
        if (((p->vObjFon0).nSize <= (int)uVar6) || ((int)Prs_BoxSignals_V._4_4_ < 2))
        goto LAB_003e64e3;
        Prs_CreateSignalOut(p,(p->vObjFon0).pArray[uVar6],pNtk,*(int *)(Prs_BoxSignals_V._8_8_ + 4))
        ;
LAB_003e53c1:
        if (__ptr_00[1] <= lVar18) goto LAB_003e6502;
        *(int *)(*(long *)(__ptr_00 + 2) + lVar18 * 4) = (int)local_98;
        if ((((pNtk->vObjs).nSize <= lVar18) || (iVar10 = (pNtk->vObjs).pArray[lVar18], iVar10 < -2)
            ) || (uVar6 = iVar10 + 2, (pNtk->vBoxes).nSize <= (int)uVar6)) goto LAB_003e64e3;
        iVar10 = (pNtk->vBoxes).pArray[uVar6];
        if (iVar10 != 0) {
          Cba_ObjSetName(p,(int)local_98,iVar10);
        }
      }
      else {
        if (iVar10 < -1) goto LAB_003e64e3;
        pcVar15 = Abc_NamStr(pNtk->pStrs,piVar3[iVar10 + 1U]);
        iVar10 = strncmp(pcVar15,"VERIFIC_PWR",0xb);
        pPVar17 = s_VerInfo + 1;
        if (iVar10 != 0) {
          lVar28 = 0;
          do {
            lVar29 = lVar28;
            if (lVar29 + 0x40 == 0x1440) {
              CVar23 = CBA_OBJ_BOX;
              iVar10 = -1;
              local_b0 = (char **)0x0;
              goto LAB_003e4e39;
            }
            pcVar4 = *(char **)((long)s_VerInfo[2].pSigNames + lVar29 + -8);
            sVar16 = strlen(pcVar4);
            iVar10 = strncmp(pcVar15,pcVar4,(long)(int)sVar16);
            lVar28 = lVar29 + 0x40;
          } while (iVar10 != 0);
          pPVar17 = (Prs_VerInfo_t *)((long)s_VerInfo[2].pSigNames + lVar29 + -0x10);
        }
        iVar10 = pPVar17->nInputs;
        local_b0 = pPVar17->pSigNames + iVar10;
        CVar23 = pPVar17->Type;
LAB_003e4e39:
        if ((int)CVar23 < 0x2f) {
          if (CVar23 != CBA_OBJ_BOX) {
            if (CVar23 == CBA_BOX_NMUX) {
              iVar10 = strncmp(pcVar15,"wide_mux_",9);
              if (iVar10 == 0) {
                pcVar15 = pcVar15 + 9;
              }
              else {
                iVar10 = strncmp(pcVar15,"Mux_",4);
                if (iVar10 != 0) {
                  __assert_fail("0",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/cba/cbaReadVer.c"
                                ,0x777,"int Prs_CreateVerilogNtk(Cba_Ntk_t *, Prs_Ntk_t *)");
                }
                pcVar15 = pcVar15 + 4;
              }
              iVar10 = atoi(pcVar15);
              iVar10 = (1 << ((byte)iVar10 & 0x1f)) + 1;
              CVar23 = CBA_BOX_NMUX;
            }
            else if (CVar23 == CBA_BOX_SEL) {
              iVar10 = strncmp(pcVar15,"wide_select_",0xc);
              if (iVar10 == 0) {
                pcVar15 = pcVar15 + 0xc;
              }
              else {
                iVar10 = strncmp(pcVar15,"Select_",7);
                if (iVar10 != 0) {
                  __assert_fail("0",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/cba/cbaReadVer.c"
                                ,0x77f,"int Prs_CreateVerilogNtk(Cba_Ntk_t *, Prs_Ntk_t *)");
                }
                pcVar15 = pcVar15 + 7;
              }
              iVar10 = atoi(pcVar15);
              iVar10 = iVar10 + 1;
              CVar23 = CBA_BOX_SEL;
            }
            else {
LAB_003e4ebe:
              if ((((CVar23 == CBA_BOX_DFFRS) || (CVar23 == CBA_BOX_LATCHRS)) &&
                  (iVar13 = strncmp(pcVar15,"wide_",5), iVar13 == 0)) &&
                 (iVar13 = Prs_CreateFlopSetReset
                                     (p,pNtk,(Vec_Int_t *)Prs_BoxSignals_V,(int *)0x0,(int *)0x0,
                                      (int *)0x0,(int *)0x0), iVar13 == 0)) {
                iVar10 = atoi(pcVar15 + (ulong)(CVar23 != CBA_BOX_DFFRS) * 2 + 0xb);
                CVar23 = CBA_BOX_CONCAT;
              }
            }
            uVar22 = 1;
            pvVar26 = (void *)0x0;
            goto LAB_003e501b;
          }
          pCVar2 = p->pDesign;
          uVar6 = Abc_NamStrFind(pCVar2->pMods,pcVar15);
          if (((int)uVar6 < 1) || ((pCVar2->vNtks).nSize <= (int)uVar6)) {
            pvVar26 = (void *)0x0;
          }
          else {
            pvVar26 = (pCVar2->vNtks).pArray[uVar6];
          }
          if (pvVar26 != (void *)0x0) {
            iVar10 = *(int *)((long)pvVar26 + 0x1c);
            uVar22 = (ulong)*(uint *)((long)pvVar26 + 0x2c);
            CVar23 = CBA_OBJ_BOX;
            goto LAB_003e501b;
          }
          pvVar26 = (void *)0x0;
          printf("Fatal error: Cannot find module \"%s\".\n",pcVar15);
LAB_003e53a6:
          cVar25 = (char)pvVar26;
        }
        else {
          uVar22 = 2;
          pvVar26 = (void *)0x0;
          if (CVar23 != CBA_BOX_ADD) {
            if (CVar23 == CBA_BOX_RAMWC) goto LAB_003e53a6;
            if (CVar23 != CBA_BOX_DFFCPL) goto LAB_003e4ebe;
          }
LAB_003e501b:
          uVar6 = Cba_ObjAlloc(p,CVar23,iVar10,(int)uVar22);
          local_98 = (Cba_Man_t *)(ulong)uVar6;
          if (pvVar26 == (void *)0x0) {
            pCVar2 = p->pDesign;
            lVar28 = extraout_RDX_05;
            if (0 < (pCVar2->vUsed2).nSize) {
              piVar20 = (pCVar2->vUsed2).pArray;
              lVar28 = 0;
              do {
                iVar10 = piVar20[lVar28];
                if (((long)iVar10 < 0) || ((pCVar2->vNameMap2).nSize <= iVar10)) goto LAB_003e6502;
                (pCVar2->vNameMap2).pArray[iVar10] = 0;
                lVar28 = lVar28 + 1;
              } while (lVar28 < (pCVar2->vUsed2).nSize);
            }
            (pCVar2->vUsed2).nSize = 0;
            if (0 < (int)uVar22) {
              uVar27 = 0;
              do {
                uVar8 = Abc_NamStrFind(p->pDesign->pStrs,local_b0[uVar27]);
                pCVar2 = p->pDesign;
                Vec_IntFillExtra(&pCVar2->vNameMap2,uVar8 + 1,Fill_08);
                if (((int)uVar8 < 0) || ((pCVar2->vNameMap2).nSize <= (int)uVar8))
                goto LAB_003e64e3;
                if ((pCVar2->vNameMap2).pArray[uVar8] != 0) goto LAB_003e6521;
                Vec_IntFillExtra(&pCVar2->vNameMap2,uVar8 + 1,Fill_09);
                if ((pCVar2->vNameMap2).nSize <= (int)uVar8) goto LAB_003e6502;
                uVar1 = uVar27 + 1;
                (pCVar2->vNameMap2).pArray[uVar8] = (int)uVar27 + 1;
                Vec_IntPush(&pCVar2->vUsed2,uVar8);
                lVar28 = extraout_RDX_08;
                uVar27 = uVar1;
              } while (uVar22 != uVar1);
            }
          }
          else {
            if ((int)uVar6 < 1) {
              pcVar15 = "i>0";
LAB_003e682b:
              __assert_fail(pcVar15,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/cba/cba.h"
                            ,0xef,"int Cba_ObjFunc(Cba_Ntk_t *, int)");
            }
            if ((p->vObjFunc).nSize < 1) {
              pcVar15 = "Cba_NtkHasObjFuncs(p)";
              goto LAB_003e682b;
            }
            iVar10 = *(int *)((long)pvVar26 + 8);
            Vec_IntFillExtra(&p->vObjFunc,uVar6 + 1,(int)extraout_RDX_05);
            if ((p->vObjFunc).nSize <= (int)uVar6) goto LAB_003e64e3;
            if ((p->vObjFunc).pArray[uVar6] != 0) {
              __assert_fail("Cba_ObjFunc(p, i) == 0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/cba/cba.h"
                            ,0xf8,"void Cba_ObjSetFunc(Cba_Ntk_t *, int, int)");
            }
            Vec_IntFillExtra(&p->vObjFunc,uVar6 + 1,Fill_05);
            if ((p->vObjFunc).nSize <= (int)uVar6) goto LAB_003e6502;
            (p->vObjFunc).pArray[uVar6] = iVar10;
            pCVar2 = p->pDesign;
            lVar28 = extraout_RDX_06;
            if (0 < (pCVar2->vUsed2).nSize) {
              piVar20 = (pCVar2->vUsed2).pArray;
              lVar28 = 0;
              do {
                iVar10 = piVar20[lVar28];
                if (((long)iVar10 < 0) || ((pCVar2->vNameMap2).nSize <= iVar10)) goto LAB_003e6502;
                (pCVar2->vNameMap2).pArray[iVar10] = 0;
                lVar28 = lVar28 + 1;
              } while (lVar28 < (pCVar2->vUsed2).nSize);
            }
            (pCVar2->vUsed2).nSize = 0;
            if (0 < *(int *)((long)pvVar26 + 0x2c)) {
              lVar29 = 0;
              do {
                iVar10 = *(int *)(*(long *)((long)pvVar26 + 0x30) + lVar29 * 4);
                if ((long)iVar10 < 1) goto LAB_003e6540;
                if (*(int *)((long)pvVar26 + 0xcc) < 1) goto LAB_003e6549;
                Vec_IntFillExtra((Vec_Int_t *)((long)pvVar26 + 200),iVar10 + 1,(int)lVar28);
                if (*(int *)((long)pvVar26 + 0xcc) <= iVar10) goto LAB_003e64e3;
                iVar10 = *(int *)(*(long *)((long)pvVar26 + 0xd0) + (long)iVar10 * 4);
                lVar28 = (long)iVar10;
                pCVar2 = p->pDesign;
                Vec_IntFillExtra(&pCVar2->vNameMap2,iVar10 + 1,Fill_06);
                if ((lVar28 < 0) || ((pCVar2->vNameMap2).nSize <= iVar10)) goto LAB_003e64e3;
                if ((pCVar2->vNameMap2).pArray[lVar28] != 0) goto LAB_003e6521;
                Vec_IntFillExtra(&pCVar2->vNameMap2,iVar10 + 1,Fill_07);
                if ((pCVar2->vNameMap2).nSize <= iVar10) goto LAB_003e6502;
                lVar30 = lVar29 + 1;
                (pCVar2->vNameMap2).pArray[lVar28] = (int)lVar29 + 1;
                Vec_IntPush(&pCVar2->vUsed2,iVar10);
                lVar28 = extraout_RDX_07;
                lVar29 = lVar30;
              } while (lVar30 < *(int *)((long)pvVar26 + 0x2c));
            }
          }
          pvVar26 = (void *)0x1;
          cVar25 = '\x01';
          if (1 < (int)Prs_BoxSignals_V._4_4_) {
            lVar29 = 1;
            do {
              iVar10 = *(int *)(Prs_BoxSignals_V._8_8_ + -4 + lVar29 * 4);
              lVar30 = (long)iVar10;
              iVar13 = *(int *)(Prs_BoxSignals_V._8_8_ + lVar29 * 4);
              pCVar2 = p->pDesign;
              Vec_IntFillExtra(&pCVar2->vNameMap2,iVar10 + 1,(int)lVar28);
              if ((lVar30 < 0) || ((pCVar2->vNameMap2).nSize <= iVar10)) goto LAB_003e64e3;
              lVar28 = extraout_RDX_09;
              if ((pCVar2->vNameMap2).pArray[lVar30] != 0) {
                pCVar2 = p->pDesign;
                Vec_IntFillExtra(&pCVar2->vNameMap2,iVar10 + 1,(int)extraout_RDX_09);
                if ((pCVar2->vNameMap2).nSize <= iVar10) goto LAB_003e64e3;
                if ((int)uVar6 < 1) {
                  __assert_fail("i>0",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/cba/cba.h"
                                ,0xea,"int Cba_ObjFon(Cba_Ntk_t *, int, int)");
                }
                if ((p->vObjFon0).nSize <= (int)uVar6) goto LAB_003e64e3;
                Prs_CreateSignalOut(p,(pCVar2->vNameMap2).pArray[lVar30] + -1 +
                                      (p->vObjFon0).pArray[uVar6],pNtk,iVar13);
                lVar28 = extraout_RDX_10;
              }
              lVar29 = lVar29 + 2;
            } while ((int)lVar29 < (int)Prs_BoxSignals_V._4_4_);
            goto LAB_003e53a6;
          }
        }
        if (cVar25 != '\0') goto LAB_003e53c1;
      }
      lVar18 = lVar18 + 1;
    } while (lVar18 < (pNtk->vObjs).nSize);
  }
  iVar10 = (p->vArray0).nSize;
  if (iVar10 != 0) {
    if (0x55555554 < iVar10 * -0x55555555 + 0x2aaaaaaaU) {
      __assert_fail("Vec_IntSize(p) % nMulti == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                    ,0x572,"void Vec_IntSortMulti(Vec_Int_t *, int, int)");
    }
    qsort((p->vArray0).pArray,(long)(iVar10 / 3),0xc,Vec_IntSortCompare1);
    iVar10 = 0;
    lVar18 = 0;
    if (2 < (p->vArray0).nSize) {
      lVar18 = 0;
      iVar10 = 0;
      iVar13 = -1;
      do {
        piVar20 = (p->vArray0).pArray;
        iVar5 = piVar20[lVar18];
        iVar7 = (int)lVar18;
        if (iVar13 != iVar5 && iVar13 != -1) {
          Prs_CreateOutConcat(p,piVar20 + iVar10,(iVar7 - iVar10) / 3);
          iVar10 = iVar7;
        }
        lVar18 = lVar18 + 3;
        iVar13 = iVar5;
      } while (iVar7 + 5 < (p->vArray0).nSize);
    }
    Prs_CreateOutConcat(p,(p->vArray0).pArray + iVar10,((int)lVar18 - iVar10) / 3);
  }
  if (0 < (pNtk->vObjs).nSize) {
    local_38 = &p->vFonName;
    local_48 = (Vec_Ptr_t *)&p->vObjFunc;
    local_40 = &p->vFonRange;
    lVar18 = 0;
    do {
      piVar20 = (pNtk->vObjs).pArray;
      iVar10 = piVar20[lVar18];
      if (((long)iVar10 < 0) || (iVar13 = (pNtk->vBoxes).nSize, iVar13 <= iVar10))
      goto LAB_003e64e3;
      piVar3 = (pNtk->vBoxes).pArray;
      Prs_BoxSignals_V._0_4_ = piVar3[iVar10] + -2;
      iVar10 = piVar20[lVar18];
      Prs_BoxSignals_V._4_4_ = Prs_BoxSignals_V._0_4_;
      if ((iVar10 < -3) || (iVar13 <= (int)(iVar10 + 3U))) goto LAB_003e6660;
      Prs_BoxSignals_V._8_8_ = piVar3 + (iVar10 + 3U);
      if (__ptr_00[1] <= lVar18) goto LAB_003e64e3;
      uVar6 = *(uint *)(*(long *)(__ptr_00 + 2) + lVar18 * 4);
      uVar8 = iVar10 + 1;
      if (*(int *)Prs_BoxSignals_V._8_8_ == 0) {
        if (iVar13 <= (int)uVar8 || iVar10 < -1) goto LAB_003e64e3;
        CVar23 = piVar3[uVar8];
        if (3 < (int)Prs_BoxSignals_V._0_4_) {
          lVar28 = 0;
          do {
            iVar13 = Prs_CreateSignalIn(p,pNtk,*(int *)(Prs_BoxSignals_V._8_8_ + 0xc + lVar28 * 4));
            iVar10 = (int)lVar28;
            if (iVar13 != 0) {
              Cba_ObjSetFinFon(p,uVar6,(iVar10 + 2U >> 1) - 1,iVar13);
            }
            lVar28 = lVar28 + 2;
          } while (iVar10 + 5 < (int)Prs_BoxSignals_V._4_4_);
        }
LAB_003e6202:
        if (CVar23 == CBA_BOX_DFFRS) {
          if ((int)uVar6 < 1) {
LAB_003e679f:
            __assert_fail("i>0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/cba/cba.h"
                          ,0xfe,"int Cba_ObjFinFon(Cba_Ntk_t *, int, int)");
          }
          if ((p->vObjFin0).nSize <= (int)uVar6) goto LAB_003e64e3;
          iVar10 = (p->vObjFin0).pArray[uVar6];
          if (iVar10 < 0) {
LAB_003e667f:
            __assert_fail("f>0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/cba/cba.h"
                          ,0xfc,"int Cba_FinFon(Cba_Ntk_t *, int)");
          }
          uVar8 = iVar10 + 1;
          if ((p->vFinFon).nSize <= (int)uVar8) goto LAB_003e64e3;
          if ((p->vFinFon).pArray[uVar8] == 0) {
            Cba_ObjSetFinFon(p,uVar6,1,-2);
          }
          if ((p->vObjFin0).nSize <= (int)uVar6) goto LAB_003e64e3;
          iVar10 = (p->vObjFin0).pArray[uVar6];
          if (iVar10 < -1) goto LAB_003e667f;
          uVar8 = iVar10 + 2;
          if ((p->vFinFon).nSize <= (int)uVar8) goto LAB_003e64e3;
          if ((p->vFinFon).pArray[uVar8] == 0) {
            Cba_ObjSetFinFon(p,uVar6,2,-2);
          }
        }
        else if (CVar23 == CBA_BOX_ADD) {
          if ((int)uVar6 < 1) goto LAB_003e679f;
          if ((p->vObjFin0).nSize <= (int)uVar6) goto LAB_003e64e3;
          iVar10 = (p->vObjFin0).pArray[uVar6];
          if ((long)iVar10 < 1) goto LAB_003e667f;
          if ((p->vFinFon).nSize <= iVar10) goto LAB_003e64e3;
          if ((p->vFinFon).pArray[iVar10] == 0) {
            Cba_ObjSetFinFon(p,uVar6,0,-2);
          }
        }
      }
      else {
        if (iVar13 <= (int)uVar8 || iVar10 < -1) goto LAB_003e64e3;
        pcVar15 = Abc_NamStr(pNtk->pStrs,piVar3[uVar8]);
        iVar10 = strncmp(pcVar15,"VERIFIC_PWR",0xb);
        pPVar17 = s_VerInfo + 1;
        piVar20 = extraout_RDX_11;
        if (iVar10 != 0) {
          lVar28 = 0;
          do {
            lVar29 = lVar28;
            if (lVar29 + 0x40 == 0x1440) {
              CVar23 = CBA_OBJ_BOX;
              uVar8 = 0xffffffff;
              local_98 = (Cba_Man_t *)0x0;
              goto LAB_003e5741;
            }
            pcVar4 = *(char **)((long)s_VerInfo[2].pSigNames + lVar29 + -8);
            sVar16 = strlen(pcVar4);
            iVar10 = strncmp(pcVar15,pcVar4,(long)(int)sVar16);
            lVar28 = lVar29 + 0x40;
            piVar20 = extraout_RDX_12;
          } while (iVar10 != 0);
          pPVar17 = (Prs_VerInfo_t *)((long)s_VerInfo[2].pSigNames + lVar29 + -0x10);
        }
        CVar23 = pPVar17->Type;
        uVar8 = pPVar17->nInputs;
        local_98 = (Cba_Man_t *)pPVar17->pSigNames;
LAB_003e5741:
        if (((CVar23 == CBA_BOX_DFFRS) || (CVar23 == CBA_BOX_LATCHRS)) &&
           (iVar10 = strncmp(pcVar15,"wide_",5), piVar20 = extraout_RDX_13, iVar10 == 0)) {
          local_4c = -1;
          local_50 = -1;
          local_54 = -1;
          local_58 = 0xffffffff;
          iVar10 = Prs_CreateFlopSetReset
                             (p,pNtk,(Vec_Int_t *)Prs_BoxSignals_V,&local_4c,&local_50,&local_54,
                              (int *)&local_58);
          uVar21 = Prs_BoxSignals_V._8_8_;
          if (iVar10 == 0) {
            uVar9 = atoi(pcVar15 + (ulong)(CVar23 != CBA_BOX_DFFRS) * 2 + 0xb);
            if ((int)uVar6 < 1) goto LAB_003e6761;
            if ((p->vObjType).nSize <= (int)uVar6) goto LAB_003e6704;
            if ((p->vObjType).pArray[uVar6] != 'Y') {
              __assert_fail("Cba_ObjType(p, iObj) == CBA_BOX_CONCAT",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/cba/cbaReadVer.c"
                            ,0x7cb,"int Prs_CreateVerilogNtk(Cba_Ntk_t *, Prs_Ntk_t *)");
            }
            if ((int)uVar8 < 0) {
              __assert_fail("nInputs >= 0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/cba/cbaReadVer.c"
                            ,0x7cd,"int Prs_CreateVerilogNtk(Cba_Ntk_t *, Prs_Ntk_t *)");
            }
            pCVar2 = p->pDesign;
            piVar20 = extraout_RDX_14;
            if (0 < (pCVar2->vUsed2).nSize) {
              piVar3 = (pCVar2->vUsed2).pArray;
              piVar20 = (int *)0x0;
              do {
                iVar13 = piVar3[(long)piVar20];
                if (((long)iVar13 < 0) || ((pCVar2->vNameMap2).nSize <= iVar13)) goto LAB_003e6502;
                (pCVar2->vNameMap2).pArray[iVar13] = 0;
                piVar20 = (int *)((long)piVar20 + 1);
              } while ((long)piVar20 < (long)(pCVar2->vUsed2).nSize);
            }
            (pCVar2->vUsed2).nSize = 0;
            if (uVar8 != 0) {
              uVar22 = 1;
              if (1 < (int)uVar8) {
                uVar22 = (ulong)uVar8;
              }
              uVar27 = 0;
              do {
                uVar11 = Abc_NamStrFind(p->pDesign->pStrs,*(char **)((long)local_98 + uVar27 * 8));
                pCVar2 = p->pDesign;
                Vec_IntFillExtra(&pCVar2->vNameMap2,uVar11 + 1,Fill_10);
                if (((int)uVar11 < 0) || ((pCVar2->vNameMap2).nSize <= (int)uVar11))
                goto LAB_003e64e3;
                if ((pCVar2->vNameMap2).pArray[uVar11] != 0) goto LAB_003e6521;
                Vec_IntFillExtra(&pCVar2->vNameMap2,uVar11 + 1,Fill_11);
                if ((pCVar2->vNameMap2).nSize <= (int)uVar11) goto LAB_003e6502;
                uVar1 = uVar27 + 1;
                (pCVar2->vNameMap2).pArray[uVar11] = (int)uVar27 + 1;
                Vec_IntPush(&pCVar2->vUsed2,uVar11);
                piVar20 = extraout_RDX_15;
                uVar27 = uVar1;
              } while (uVar22 != uVar1);
            }
            iVar13 = 0x22;
            if (0 < (int)uVar9) {
              uVar11 = 0;
              do {
                i = Cba_ObjAlloc(p,CVar23,4,1);
                if ((((pNtk->vObjs).nSize <= lVar18) ||
                    (iVar13 = (pNtk->vObjs).pArray[lVar18], iVar13 < -2)) ||
                   (uVar12 = iVar13 + 2, (pNtk->vBoxes).nSize <= (int)uVar12)) goto LAB_003e64e3;
                iVar13 = (pNtk->vBoxes).pArray[uVar12];
                iVar5 = extraout_EDX;
                if (iVar13 != 0) {
                  pcVar15 = Abc_NamStr(pNtk->pStrs,iVar13);
                  iVar13 = Cba_NtkNewStrId(p,"%s[%d]",pcVar15,(ulong)uVar11);
                  Cba_ObjSetName(p,i,iVar13);
                  iVar5 = extraout_EDX_00;
                }
                if ((int)i < 1) goto LAB_003e6587;
                iVar13 = (p->vObjFon0).nSize;
                if ((iVar13 <= (int)i) || (iVar13 <= (int)uVar6)) goto LAB_003e64e3;
                if ((p->vFonName).nSize < 1) {
                  pcVar15 = "Cba_NtkHasFonNames(p)";
LAB_003e66cd:
                  __assert_fail(pcVar15,
                                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/cba/cba.h"
                                ,0x11e,"char *Cba_FonNameStr(Cba_Ntk_t *, int)");
                }
                piVar20 = (p->vObjFon0).pArray;
                uVar12 = piVar20[uVar6];
                if ((int)uVar12 < 1) {
                  pcVar15 = "Cba_FonIsReal(f)";
                  goto LAB_003e66cd;
                }
                iVar13 = piVar20[i];
                Vec_IntFillExtra(local_38,uVar12 + 1,iVar5);
                if ((p->vFonName).nSize <= (int)uVar12) goto LAB_003e64e3;
                pcVar15 = Abc_NamStr(p->pDesign->pStrs,(p->vFonName).pArray[uVar12]);
                iVar5 = Cba_NtkNewStrId(p,"%s[%d]",pcVar15,(ulong)uVar11);
                Cba_FonSetName(p,iVar13,iVar5);
                Cba_ObjSetFinFon(p,uVar6,~uVar11 + uVar9,iVar13);
                piVar20 = extraout_RDX_16;
                if (1 < (int)Prs_BoxSignals_V._4_4_) {
                  lVar28 = 1;
                  do {
                    iVar13 = *(int *)(Prs_BoxSignals_V._8_8_ + -4 + lVar28 * 4);
                    lVar29 = (long)iVar13;
                    iVar5 = *(int *)(Prs_BoxSignals_V._8_8_ + lVar28 * 4);
                    pCVar2 = p->pDesign;
                    Vec_IntFillExtra(&pCVar2->vNameMap2,iVar13 + 1,(int)piVar20);
                    if ((lVar29 < 0) || ((pCVar2->vNameMap2).nSize <= iVar13)) goto LAB_003e64e3;
                    piVar20 = extraout_RDX_17;
                    if ((pCVar2->vNameMap2).pArray[lVar29] != 0) {
                      pCVar2 = p->pDesign;
                      Vec_IntFillExtra(&pCVar2->vNameMap2,iVar13 + 1,(int)extraout_RDX_17);
                      if ((pCVar2->vNameMap2).nSize <= iVar13) goto LAB_003e64e3;
                      iVar13 = (pCVar2->vNameMap2).pArray[lVar29];
                      iVar5 = Prs_CreateSignalIn(p,pNtk,iVar5);
                      if (iVar5 == 0) {
                        __assert_fail("iFon",
                                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/cba/cbaReadVer.c"
                                      ,0x7eb,"int Prs_CreateVerilogNtk(Cba_Ntk_t *, Prs_Ntk_t *)");
                      }
                      if (iVar13 < 4) {
                        iVar5 = Prs_CreateSlice(p,iVar5,pNtk_00,0);
                      }
                      Cba_ObjSetFinFon(p,i,iVar13 + -1,iVar5);
                      piVar20 = extraout_RDX_18;
                    }
                    lVar28 = lVar28 + 2;
                  } while ((int)lVar28 < (int)Prs_BoxSignals_V._4_4_);
                }
                uVar11 = uVar11 + 1;
              } while (uVar11 != uVar9);
              iVar13 = 0x22;
            }
          }
          else {
            if (((long)local_4c < 0) || ((int)Prs_BoxSignals_V._4_4_ <= local_4c))
            goto LAB_003e6502;
            *(int *)(Prs_BoxSignals_V._8_8_ + (long)local_4c * 4) = local_54;
            if (((long)local_50 < 0) || ((int)Prs_BoxSignals_V._4_4_ <= local_50))
            goto LAB_003e6502;
            piVar20 = (int *)(ulong)local_58;
            *(uint *)(uVar21 + (long)local_50 * 4) = local_58;
            iVar13 = 0;
          }
          if (iVar10 != 0) goto LAB_003e5bef;
        }
        else {
LAB_003e5bef:
          if ((int)uVar6 < 1) {
LAB_003e6761:
            __assert_fail("i>0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/cba/cba.h"
                          ,0xd5,"Cba_ObjType_t Cba_ObjType(Cba_Ntk_t *, int)");
          }
          if ((p->vObjType).nSize <= (int)uVar6) {
LAB_003e6704:
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecStr.h"
                          ,0x164,"char Vec_StrEntry(Vec_Str_t *, int)");
          }
          pcVar15 = (p->vObjType).pArray;
          if (CVar23 != (byte)pcVar15[uVar6]) {
            __assert_fail("Type == Cba_ObjType(p, iObj)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/cba/cbaReadVer.c"
                          ,0x7f5,"int Prs_CreateVerilogNtk(Cba_Ntk_t *, Prs_Ntk_t *)");
          }
          pCVar2 = p->pDesign;
          if (0 < (pCVar2->vUsed2).nSize) {
            piVar20 = (pCVar2->vUsed2).pArray;
            lVar28 = 0;
            do {
              iVar10 = piVar20[lVar28];
              if (((long)iVar10 < 0) || ((pCVar2->vNameMap2).nSize <= iVar10)) goto LAB_003e6502;
              (pCVar2->vNameMap2).pArray[iVar10] = 0;
              lVar28 = lVar28 + 1;
            } while (lVar28 < (pCVar2->vUsed2).nSize);
          }
          (pCVar2->vUsed2).nSize = 0;
          if (CVar23 == CBA_OBJ_BOX) {
            if ((p->vObjType).nSize <= (int)uVar6) goto LAB_003e6704;
            uVar8 = 0;
            if ((pcVar15[uVar6] == '\x03') && (uVar8 = 0, 0 < (p->vObjFunc).nSize)) {
              Vec_IntFillExtra((Vec_Int_t *)local_48,uVar6 + 1,(int)piVar20);
              if ((p->vObjFunc).nSize <= (int)uVar6) goto LAB_003e64e3;
              uVar8 = (p->vObjFunc).pArray[uVar6];
            }
            if (((int)uVar8 < 1) || ((p->pDesign->vNtks).nSize <= (int)uVar8)) {
              pvVar26 = (void *)0x0;
            }
            else {
              pvVar26 = (p->pDesign->vNtks).pArray[uVar8];
            }
            if ((p->vObjFin0).nSize <= (int)(uVar6 + 1)) goto LAB_003e64e3;
            piVar20 = (p->vObjFin0).pArray;
            uVar8 = piVar20[(ulong)uVar6 + 1] - piVar20[uVar6];
            piVar20 = (int *)(ulong)uVar8;
            if (*(uint *)((long)pvVar26 + 0x1c) != uVar8) {
              __assert_fail("Cba_NtkPiNum(pBox) == Cba_ObjFinNum(p, iObj)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/cba/cbaReadVer.c"
                            ,0x7fc,"int Prs_CreateVerilogNtk(Cba_Ntk_t *, Prs_Ntk_t *)");
            }
            if ((p->vObjFon0).nSize <= (int)(uVar6 + 1)) goto LAB_003e64e3;
            piVar3 = (p->vObjFon0).pArray;
            if (*(int *)((long)pvVar26 + 0x2c) != piVar3[(ulong)uVar6 + 1] - piVar3[uVar6]) {
              __assert_fail("Cba_NtkPoNum(pBox) == Cba_ObjFonNum(p, iObj)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/cba/cbaReadVer.c"
                            ,0x7fd,"int Prs_CreateVerilogNtk(Cba_Ntk_t *, Prs_Ntk_t *)");
            }
            if (0 < *(int *)((long)pvVar26 + 0x1c)) {
              lVar28 = 0;
              do {
                iVar10 = *(int *)(*(long *)((long)pvVar26 + 0x20) + lVar28 * 4);
                if ((long)iVar10 < 1) goto LAB_003e6540;
                if (*(int *)((long)pvVar26 + 0xcc) < 1) goto LAB_003e6549;
                Vec_IntFillExtra((Vec_Int_t *)((long)pvVar26 + 200),iVar10 + 1,(int)piVar20);
                if (*(int *)((long)pvVar26 + 0xcc) <= iVar10) goto LAB_003e64e3;
                iVar10 = *(int *)(*(long *)((long)pvVar26 + 0xd0) + (long)iVar10 * 4);
                lVar29 = (long)iVar10;
                pCVar2 = p->pDesign;
                Vec_IntFillExtra(&pCVar2->vNameMap2,iVar10 + 1,Fill_14);
                if ((lVar29 < 0) || ((pCVar2->vNameMap2).nSize <= iVar10)) goto LAB_003e64e3;
                if ((pCVar2->vNameMap2).pArray[lVar29] != 0) {
LAB_003e6521:
                  __assert_fail("Vec_IntGetEntry(&p->vNameMap2, i) == 0",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/cba/cba.h"
                                ,0x328,"void Cba_ManSetMap2(Cba_Man_t *, int, int)");
                }
                Vec_IntFillExtra(&pCVar2->vNameMap2,iVar10 + 1,Fill_15);
                if ((pCVar2->vNameMap2).nSize <= iVar10) goto LAB_003e6502;
                lVar30 = lVar28 + 1;
                (pCVar2->vNameMap2).pArray[lVar29] = (int)lVar28 + 1;
                Vec_IntPush(&pCVar2->vUsed2,iVar10);
                piVar20 = extraout_RDX_20;
                lVar28 = lVar30;
              } while (lVar30 < *(int *)((long)pvVar26 + 0x1c));
            }
          }
          else {
            if ((int)uVar8 < 0) {
              __assert_fail("nInputs >= 0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/cba/cbaReadVer.c"
                            ,0x803,"int Prs_CreateVerilogNtk(Cba_Ntk_t *, Prs_Ntk_t *)");
            }
            if (uVar8 != 0) {
              uVar22 = 0;
              do {
                uVar9 = Abc_NamStrFind(p->pDesign->pStrs,*(char **)((long)local_98 + uVar22 * 8));
                pCVar2 = p->pDesign;
                Vec_IntFillExtra(&pCVar2->vNameMap2,uVar9 + 1,Fill_12);
                if (((int)uVar9 < 0) || ((pCVar2->vNameMap2).nSize <= (int)uVar9))
                goto LAB_003e64e3;
                if ((pCVar2->vNameMap2).pArray[uVar9] != 0) goto LAB_003e6521;
                Vec_IntFillExtra(&pCVar2->vNameMap2,uVar9 + 1,Fill_13);
                if ((pCVar2->vNameMap2).nSize <= (int)uVar9) goto LAB_003e6502;
                uVar27 = uVar22 + 1;
                (pCVar2->vNameMap2).pArray[uVar9] = (int)uVar22 + 1;
                Vec_IntPush(&pCVar2->vUsed2,uVar9);
                piVar20 = extraout_RDX_19;
                uVar22 = uVar27;
              } while (uVar8 != uVar27);
            }
          }
          if (1 < (int)Prs_BoxSignals_V._4_4_) {
            lVar28 = 1;
            do {
              iVar10 = *(int *)(Prs_BoxSignals_V._8_8_ + -4 + lVar28 * 4);
              lVar29 = (long)iVar10;
              iVar13 = *(int *)(Prs_BoxSignals_V._8_8_ + lVar28 * 4);
              pCVar2 = p->pDesign;
              Vec_IntFillExtra(&pCVar2->vNameMap2,iVar10 + 1,(int)piVar20);
              if ((lVar29 < 0) || ((pCVar2->vNameMap2).nSize <= iVar10)) goto LAB_003e64e3;
              piVar20 = extraout_RDX_21;
              if ((pCVar2->vNameMap2).pArray[lVar29] != 0) {
                pCVar2 = p->pDesign;
                Vec_IntFillExtra(&pCVar2->vNameMap2,iVar10 + 1,(int)extraout_RDX_21);
                if (((pCVar2->vNameMap2).nSize <= iVar10) ||
                   ((p->vObjFin0).nSize <= (int)(uVar6 + 1))) goto LAB_003e64e3;
                iVar10 = (pCVar2->vNameMap2).pArray[lVar29];
                piVar20 = (p->vObjFin0).pArray;
                if (piVar20[(ulong)uVar6 + 1] - piVar20[uVar6] < iVar10) {
                  __assert_fail("Index < nBits",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/cba/cbaReadVer.c"
                                ,0x80d,"int Prs_CreateVerilogNtk(Cba_Ntk_t *, Prs_Ntk_t *)");
                }
                iVar13 = Prs_CreateSignalIn(p,pNtk,iVar13);
                piVar20 = extraout_RDX_22;
                if (iVar13 != 0) {
                  Cba_ObjSetFinFon(p,uVar6,iVar10 + -1,iVar13);
                  piVar20 = extraout_RDX_23;
                }
              }
              lVar28 = lVar28 + 2;
            } while ((int)lVar28 < (int)Prs_BoxSignals_V._4_4_);
          }
          iVar13 = 0;
          if ((CVar23 & ~CBA_OBJ_PI) == CBA_BOX_NMUX) {
            if ((p->vObjFin0).nSize <= (int)uVar6) goto LAB_003e64e3;
            iVar10 = (p->vObjFin0).pArray[uVar6];
            if (iVar10 < 0) goto LAB_003e667f;
            uVar8 = iVar10 + 1;
            if ((p->vFinFon).nSize <= (int)uVar8) goto LAB_003e64e3;
            uVar8 = (p->vFinFon).pArray[uVar8];
            iVar13 = Cba_FonRangeSize(p,uVar8);
            iVar10 = (p->vObjFin0).nSize;
            if (iVar10 <= (int)(uVar6 + 1)) goto LAB_003e64e3;
            piVar20 = (p->vObjFin0).pArray;
            iVar7 = piVar20[uVar6];
            iVar24 = piVar20[(ulong)uVar6 + 1] - iVar7;
            iVar5 = iVar24 + -1;
            iVar14 = iVar13 / iVar5;
            if (iVar24 < 2) {
              __assert_fail("Cba_ObjFinNum(p, iObj) >= 2",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/cba/cbaReadVer.c"
                            ,0x81a,"int Prs_CreateVerilogNtk(Cba_Ntk_t *, Prs_Ntk_t *)");
            }
            if (iVar5 * iVar14 != iVar13) {
              __assert_fail("Slice * nParts == nBits",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/cba/cbaReadVer.c"
                            ,0x81b,"int Prs_CreateVerilogNtk(Cba_Ntk_t *, Prs_Ntk_t *)");
            }
            if (iVar10 <= (int)uVar6) goto LAB_003e64e3;
            if (iVar7 < 0) goto LAB_003e667f;
            uVar9 = iVar7 + 1;
            if ((p->vFinFon).nSize <= (int)uVar9) goto LAB_003e64e3;
            piVar20 = (p->vFinFon).pArray;
            if (piVar20[uVar9] == 0) {
              __assert_fail("Cba_ObjFinFon(p, i, k)!= 0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/cba/cba.h"
                            ,0x102,"void Cba_ObjCleanFinFon(Cba_Ntk_t *, int, int)");
            }
            piVar20[uVar9] = 0;
            if ((int)uVar8 < 0) {
              uVar9 = Cba_ObjAlloc(p,CBA_BOX_BUF,1,1);
              Cba_ObjSetFinFon(p,uVar9,0,uVar8);
              if ((int)uVar9 < 1) {
LAB_003e6587:
                __assert_fail("i>0",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/cba/cba.h"
                              ,0xe8,"int Cba_ObjFon0(Cba_Ntk_t *, int)");
              }
              if ((p->vObjFon0).nSize <= (int)uVar9) goto LAB_003e64e3;
              uVar8 = (p->vObjFon0).pArray[uVar9];
              iVar10 = Cba_NtkNewStrId(p,"_buf_const_%d",(ulong)uVar9);
              Cba_FonSetName(p,uVar8,iVar10);
              iVar10 = Hash_Int2ManInsert(p->pDesign->vHash,iVar13 + -1,0,uVar9);
              if ((p->vFonRange).nSize < 1) {
LAB_003e65c5:
                __assert_fail("Cba_NtkHasFonRanges(p)",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/cba/cba.h"
                              ,0x119,"void Cba_FonSetRange(Cba_Ntk_t *, int, int)");
              }
              if (iVar10 < 0) {
LAB_003e65e4:
                __assert_fail("Var >= 0 && !(c >> 1)",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                              ,0x12e,"int Abc_Var2Lit(int, int)");
              }
              Vec_IntFillExtra(local_40,uVar8 + 1,Fill_16);
              if (((int)uVar8 < 0) || ((p->vFonRange).nSize <= (int)uVar8)) {
LAB_003e6502:
                __assert_fail("i >= 0 && i < p->nSize",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                              ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
              }
              (p->vFonRange).pArray[uVar8] = iVar10 * 2;
            }
            if (iVar5 < 2) {
              iVar5 = 1;
            }
            iVar13 = 0;
            iVar10 = 1;
            do {
              iVar7 = Hash_Int2ManInsert(p->pDesign->vHash,iVar14 + -1 + iVar13,iVar13,
                                         (int)p->pDesign);
              iVar7 = Prs_CreateSlice(p,uVar8,pNtk_01,iVar7);
              Cba_ObjSetFinFon(p,uVar6,iVar10,iVar7);
              iVar13 = iVar13 + iVar14;
              bVar31 = iVar10 != iVar5;
              iVar10 = iVar10 + 1;
            } while (bVar31);
            iVar13 = 0;
          }
        }
        if (iVar13 == 0) goto LAB_003e6202;
      }
      lVar18 = lVar18 + 1;
    } while (lVar18 < (pNtk->vObjs).nSize);
  }
  if (*(void **)(__ptr_00 + 2) != (void *)0x0) {
    free(*(void **)(__ptr_00 + 2));
    __ptr_00[2] = 0;
    __ptr_00[3] = 0;
  }
  free(__ptr_00);
  if (0 < (pNtk->vOutputs).nSize) {
    lVar18 = 0;
    uVar21 = extraout_RDX_24;
    do {
      if (((pNtk->vOutputsR).nSize <= lVar18) || ((p->vOutputs).nSize <= lVar18)) {
LAB_003e64e3:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      iVar10 = (p->vOutputs).pArray[lVar18];
      if ((long)iVar10 < 1) goto LAB_003e6540;
      if ((p->vObjName).nSize < 1) goto LAB_003e6549;
      iVar13 = (pNtk->vOutputs).pArray[lVar18];
      uVar6 = (pNtk->vOutputsR).pArray[lVar18];
      Vec_IntFillExtra(&p->vObjName,iVar10 + 1,(int)uVar21);
      if ((p->vObjName).nSize <= iVar10) goto LAB_003e64e3;
      if (iVar13 != (p->vObjName).pArray[iVar10]) {
        __assert_fail("NameId == Cba_ObjName(p, iObj)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/cba/cbaReadVer.c"
                      ,0x83e,"int Prs_CreateVerilogNtk(Cba_Ntk_t *, Prs_Ntk_t *)");
      }
      iVar13 = Prs_CreateVerilogFindFon(p,iVar13);
      uVar21 = extraout_RDX_25;
      if ((iVar13 != 0) &&
         (Cba_ObjSetFinFon(p,iVar10,0,iVar13), uVar21 = extraout_RDX_26, uVar6 != 0)) {
        if ((int)uVar6 < 0) {
          __assert_fail("Lit >= 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                        ,0x12f,"int Abc_Lit2Var(int)");
        }
        uVar8 = uVar6 >> 1;
        iVar10 = 0;
        if (uVar6 != 1) {
          pVVar19 = p->pDesign->vHash->vObjs;
          if (pVVar19->nSize <= (int)(uVar8 * 4)) {
LAB_003e6660:
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                          ,0x1ba,"int *Vec_IntEntryP(Vec_Int_t *, int)");
          }
          iVar10 = pVVar19->pArray[(ulong)uVar8 * 4];
        }
        iVar5 = Cba_FonLeft(p,iVar13);
        if (iVar10 != iVar5) {
          __assert_fail("Cba_NtkRangeLeft(p, Abc_Lit2Var(RangeId)) == Cba_FonLeft(p, iFon)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/cba/cbaReadVer.c"
                        ,0x845,"int Prs_CreateVerilogNtk(Cba_Ntk_t *, Prs_Ntk_t *)");
        }
        iVar10 = 0;
        if (uVar6 != 1) {
          pVVar19 = p->pDesign->vHash->vObjs;
          uVar9 = uVar8 * 4;
          uVar6 = pVVar19->nSize;
          if (uVar6 == uVar9 || SBORROW4(uVar6,uVar9) != (int)(uVar6 + uVar8 * -4) < 0)
          goto LAB_003e6660;
          iVar10 = pVVar19->pArray[(ulong)uVar9 + 1];
        }
        iVar13 = Cba_FonRight(p,iVar13);
        uVar21 = extraout_RDX_27;
        if (iVar10 != iVar13) {
          __assert_fail("Cba_NtkRangeRight(p, Abc_Lit2Var(RangeId)) == Cba_FonRight(p, iFon)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/cba/cbaReadVer.c"
                        ,0x846,"int Prs_CreateVerilogNtk(Cba_Ntk_t *, Prs_Ntk_t *)");
        }
      }
      lVar18 = lVar18 + 1;
    } while (lVar18 < (pNtk->vOutputs).nSize);
  }
  return 0;
LAB_003e6540:
  pcVar15 = "i>0";
  goto LAB_003e6550;
LAB_003e6549:
  pcVar15 = "Cba_NtkHasObjNames(p)";
LAB_003e6550:
  __assert_fail(pcVar15,
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/cba/cba.h"
                ,0xf0,"int Cba_ObjName(Cba_Ntk_t *, int)");
}

Assistant:

int Prs_CreateVerilogNtk( Cba_Ntk_t * p, Prs_Ntk_t * pNtk )
{
    Vec_Int_t * vBox2Obj = Vec_IntStart( Prs_NtkBoxNum(pNtk) );
    Vec_Int_t * vBox;  Vec_Ptr_t * vAllRams, * vRam;
    int i, k, iObj, iTerm, iFon, FormId, ActId, RangeId, NameId, Type;
    // map inputs
    Cba_NtkCleanMap( p );
    Cba_NtkForEachPi( p, iObj, i )
        Cba_NtkSetMap( p, Cba_ObjName(p, iObj), Cba_ObjFon0(p, iObj) );

    // map wire names into their rangeID
    Vec_IntForEachEntryTwo( &pNtk->vWires, &pNtk->vWiresR, NameId, RangeId, i )
        Cba_NtkSetMap( p, NameId, -RangeId );
    Vec_IntForEachEntryTwo( &pNtk->vOutputs, &pNtk->vOutputsR, NameId, RangeId, i )
        Cba_NtkSetMap( p, NameId, -RangeId );

    // collect RAMs and create boxes
    vAllRams = Prs_CreateDetectRams( pNtk );
    if ( vAllRams )
    Vec_PtrForEachEntry( Vec_Ptr_t *, vAllRams, vRam, i )
    {
        char * pRamName = (char *)Vec_PtrEntry( vRam, 0 );
        int MemSize = Abc_Ptr2Int( (char *)Vec_PtrEntry( vRam, 1 ) );
        //char Buffer[1000]; sprintf( Buffer, "%s_box", pRamName );
        //NameId = Cba_NtkNewStrId( p, Buffer ); 
        NameId = Cba_NtkNewStrId( p, "%s_box", pRamName );
        // create RAM object
        iObj = Cba_ObjAlloc( p, CBA_BOX_RAMBOX, Vec_PtrSize(vRam)-2, 1 );
        Cba_ObjSetName( p, iObj, NameId );
        iFon = Cba_ObjFon0(p, iObj);
        NameId = Cba_NtkNewStrId( p, pRamName ); 
        Cba_FonSetName( p, iFon, NameId );
        Prs_CreateRange( p, iFon, NameId );
        assert( Cba_FonLeft(p, iFon) <= MemSize-1 );
        assert( Cba_FonRight(p, iFon) == 0 );
        //Cba_VerificSaveLineFile( p, iObj, pNet->Linefile() );
        // create write ports feeding into this object
        Vec_PtrForEachEntryStart( Vec_Int_t *, vRam, vBox, k, 2 )
        {
            int iObjNew = Cba_ObjAlloc( p, CBA_BOX_RAMWC, 4, 1 );
            int Line = Vec_IntPop( vBox );
            Vec_IntWriteEntry( vBox2Obj, Line, iObjNew );
            if ( Prs_BoxName(pNtk, Line) )
                Cba_ObjSetName( p, iObjNew, Prs_BoxName(pNtk, Line) );
            //Cba_VerificSaveLineFile( p, iObjNew, pInst->Linefile() );
            // connect output
            iFon = Cba_ObjFon0(p, iObjNew);
            Cba_FonSetRange( p, iFon, Cba_NtkHashRange(p, MemSize-1, 0) );
            //sprintf( Buffer, "%s_wp%d", pRamName, k-2 );
            //NameId = Cba_NtkNewStrId( p, Buffer ); 
            NameId = Cba_NtkNewStrId( p, "%s_wp%d", pRamName, k-2 );
            Cba_FonSetName( p, iFon, NameId );
            Cba_NtkSetMap( p, NameId, iFon );
            // connet to RAM object
            Cba_ObjSetFinFon( p, iObj, (k++)-2, iFon );
            Vec_IntFree( vBox );
        }
        Vec_PtrFree( vRam );
    }
    Vec_PtrFreeP( &vAllRams );

    // create objects
    Vec_IntClear( &p->vArray0 );
    Prs_NtkForEachBox( pNtk, vBox, i )
    {
        if ( Prs_BoxIsNode(pNtk, i) ) // node
        {
            Type = Prs_BoxNtk(pNtk, i);
            iObj = Cba_ObjAlloc( p, (Cba_ObjType_t)Type, Prs_BoxIONum(pNtk, i)-1, Type == CBA_BOX_ADD ? 2 : 1 );
            Prs_CreateSignalOut( p, Cba_ObjFon0(p, iObj), pNtk, Vec_IntEntry(vBox, 1) ); // node output
        }
        else // box
        {
            Cba_Ntk_t * pBox = NULL; int nInputs, nOutputs = 1;
            char ** pOutNames = NULL, * pNtkName = Prs_NtkStr(pNtk, Prs_BoxNtk(pNtk, i));
            Type = Prs_ManFindType( pNtkName, &nInputs, 1, &pOutNames );
            if ( Type == CBA_BOX_RAMWC )
                continue;
            if ( Type == CBA_OBJ_BOX )
            {
                pBox = Cba_ManNtkFind( p->pDesign, pNtkName );
                if ( pBox == NULL )
                {
                    printf( "Fatal error: Cannot find module \"%s\".\n", pNtkName );
                    continue;
                }
                nInputs = Cba_NtkPiNum(pBox);
                nOutputs = Cba_NtkPoNum(pBox);
            }
            else if ( Type == CBA_BOX_ADD || Type == CBA_BOX_DFFCPL )
                nOutputs = 2;
            else if ( Type == CBA_BOX_NMUX )
            {
                if ( !strncmp(pNtkName, "wide_mux_", strlen("wide_mux_")) )
                    nInputs = 1 + (1 << atoi(pNtkName+strlen("wide_mux_")));
                else if ( !strncmp(pNtkName, "Mux_", strlen("Mux_")) )
                    nInputs = 1 + (1 << atoi(pNtkName+strlen("Mux_")));
                else assert( 0 );
            }
            else if ( Type == CBA_BOX_SEL )
            {
                if ( !strncmp(pNtkName, "wide_select_", strlen("wide_select_")) )
                    nInputs = 1 + atoi(pNtkName+strlen("wide_select_"));
                else if ( !strncmp(pNtkName, "Select_", strlen("Select_")) )
                    nInputs = 1 + atoi(pNtkName+strlen("Select_"));
                else assert( 0 );
            }
            else if ( (Type == CBA_BOX_DFFRS || Type == CBA_BOX_LATCHRS) && !strncmp(pNtkName, "wide_", strlen("wide_")) && !Prs_CreateFlopSetReset(p, pNtk, vBox, NULL, NULL, NULL, NULL) )
                nInputs = atoi(pNtkName+strlen(Type == CBA_BOX_DFFRS ? "wide_dffrs_" : "wide_latchrs_")), nOutputs = 1, Type = CBA_BOX_CONCAT;
            // create object
            iObj = Cba_ObjAlloc( p, (Cba_ObjType_t)Type, nInputs, nOutputs );
            if ( pBox ) Cba_ObjSetFunc( p, iObj, Cba_NtkId(pBox) );
            // mark PO objects
            Cba_NtkCleanMap2( p );
            if ( pBox )
                Cba_NtkForEachPo( pBox, iTerm, k )
                    Cba_NtkSetMap2( p, Cba_ObjName(pBox, iTerm), k+1 );
            else
                for ( k = 0; k < nOutputs; k++ )
                    Cba_NtkSetMap2( p, Cba_NtkStrId(p, pOutNames[k]), k+1 );
            // map box fons
            Vec_IntForEachEntryDouble( vBox, FormId, ActId, k )
                if ( Cba_NtkGetMap2(p, FormId) )
                {
                    iFon = Cba_ObjFon(p, iObj, Cba_NtkGetMap2(p, FormId)-1);
                    Prs_CreateSignalOut( p, iFon, pNtk, ActId );
                }
        }
        Vec_IntWriteEntry( vBox2Obj, i, iObj );
        if ( Prs_BoxName(pNtk, i) )
            Cba_ObjSetName( p, iObj, Prs_BoxName(pNtk, i) );
        //Cba_VerificSaveLineFile( p, iObj, pInst->Linefile() );
    }

    // create concatenations for split signals
    if ( Vec_IntSize(&p->vArray0) )
    {
        int Prev = -1, Index = 0;
        Vec_IntSortMulti( &p->vArray0, 3, 0 );
        Vec_IntForEachEntryTriple( &p->vArray0, NameId, RangeId, iFon, i )
        {
            if ( Prev != -1 && Prev != NameId )
                Prs_CreateOutConcat( p, Vec_IntArray(&p->vArray0) + Index, (i - Index)/3 ), Index = i;
            Prev = NameId;         
        }
        Prs_CreateOutConcat( p, Vec_IntArray(&p->vArray0) + Index, (i - Index)/3 ), Index = i;
        //Cba_VerificSaveLineFile( p, iObj, pInst->Linefile() );
    }

    // connect objects
    Prs_NtkForEachBox( pNtk, vBox, i )
    {
        iObj = Vec_IntEntry( vBox2Obj, i );
        if ( Prs_BoxIsNode(pNtk, i) ) // node
        {
            Type = Prs_BoxNtk(pNtk, i);
            Vec_IntForEachEntryDoubleStart( vBox, FormId, ActId, k, 2 )
            {
                iFon = Prs_CreateSignalIn( p, pNtk, ActId );
                if ( iFon )
                    Cba_ObjSetFinFon( p, iObj, k/2-1, iFon ); 
            }
        }
        else // box
        {
            int nInputs = -1;
            char ** pInNames = NULL, * pNtkName = Prs_NtkStr(pNtk, Prs_BoxNtk(pNtk, i));
            Type = Prs_ManFindType( pNtkName, &nInputs, 0, &pInNames );
            if ( (Type == CBA_BOX_DFFRS || Type == CBA_BOX_LATCHRS) && !strncmp(pNtkName, "wide_", strlen("wide_")) )
            {
                int IndexSet = -1, IndexRst = -1,  iBitSet = -1, iBitRst = -1;
                int Status = Prs_CreateFlopSetReset( p, pNtk, vBox, &IndexSet, &IndexRst, &iBitSet, &iBitRst );
                if ( Status )
                {
                    Vec_IntWriteEntry( vBox, IndexSet, iBitSet );
                    Vec_IntWriteEntry( vBox, IndexRst, iBitRst );
                    // updated box should be fine
                }
                else
                {
                    int w, Width = atoi( pNtkName + strlen(Type == CBA_BOX_DFFRS ? "wide_dffrs_" : "wide_latchrs_") );
                    assert( Cba_ObjType(p, iObj) == CBA_BOX_CONCAT );
                    // prepare inputs
                    assert( nInputs >= 0 );
                    Cba_NtkCleanMap2( p );
                    for ( k = 0; k < nInputs; k++ )
                        Cba_NtkSetMap2( p, Cba_NtkStrId(p, pInNames[k]), k+1 );
                    // create bit-level objects
                    for ( w = 0; w < Width; w++ )
                    {
                        // create bit-level flop
                        int iObjNew = Cba_ObjAlloc( p, (Cba_ObjType_t)Type, 4, 1 );
                        if ( Prs_BoxName(pNtk, i) )
                        {
                            NameId = Cba_NtkNewStrId( p, "%s[%d]", Prs_NtkStr(pNtk, Prs_BoxName(pNtk, i)), w );
                            Cba_ObjSetName( p, iObjNew, NameId );
                        }
                        //Cba_VerificSaveLineFile( p, iObjNew, pInst->Linefile() );
                        // set output fon
                        iFon = Cba_ObjFon0(p, iObjNew);
                        {
                            NameId = Cba_NtkNewStrId( p, "%s[%d]", Cba_FonNameStr(p, Cba_ObjFon0(p, iObj)), w );
                            Cba_FonSetName( p, iFon, NameId );
                        }
                        // no need to map this name because it may be produced elsewhere
                        //Cba_NtkSetMap( p, NameId, iFon );
                        // add the flop
                        Cba_ObjSetFinFon( p, iObj, Width-1-w, iFon );
                        // create bit-level flops
                        Vec_IntForEachEntryDouble( vBox, FormId, ActId, k )
                            if ( Cba_NtkGetMap2(p, FormId) )
                            {
                                int Index = Cba_NtkGetMap2(p, FormId)-1;
                                iFon = Prs_CreateSignalIn( p, pNtk, ActId );  assert( iFon );
                                // create bit-select node for data/set/reset (but not for clock)
                                if ( Index < 3 ) // not clock
                                    iFon = Prs_CreateSlice( p, iFon, pNtk, 0 );
                                Cba_ObjSetFinFon( p, iObjNew, Index, iFon );
                            }
                    }
                    continue;
                }
            }
            assert( Type == Cba_ObjType(p, iObj) );
            //assert( nInputs == -1 || nInputs == Cba_ObjFinNum(p, iObj) );
            // mark PI objects
            Cba_NtkCleanMap2( p );
            if ( Type == CBA_OBJ_BOX )
            {
                Cba_Ntk_t * pBox = Cba_ObjNtk(p, iObj);
                assert( Cba_NtkPiNum(pBox) == Cba_ObjFinNum(p, iObj) );
                assert( Cba_NtkPoNum(pBox) == Cba_ObjFonNum(p, iObj) );
                Cba_NtkForEachPi( pBox, iTerm, k )
                    Cba_NtkSetMap2( p, Cba_ObjName(pBox, iTerm), k+1 );
            }
            else
            {
                assert( nInputs >= 0 );
                for ( k = 0; k < nInputs; k++ )
                    Cba_NtkSetMap2( p, Cba_NtkStrId(p, pInNames[k]), k+1 );
            }
            // connect box fins
            Vec_IntForEachEntryDouble( vBox, FormId, ActId, k )
                if ( Cba_NtkGetMap2(p, FormId) )
                {
                    int Index = Cba_NtkGetMap2(p, FormId)-1;
                    int nBits = Cba_ObjFinNum(p, iObj);
                    assert( Index < nBits );
                    iFon = Prs_CreateSignalIn( p, pNtk, ActId );
                    if ( iFon )
                        Cba_ObjSetFinFon( p, iObj, Index, iFon );
                }
            // special cases
            if ( Type == CBA_BOX_NMUX || Type == CBA_BOX_SEL )
            {
                int FonCat = Cba_ObjFinFon( p, iObj, 1 );
                int nBits  = Cba_FonRangeSize( p, FonCat );
                int nParts = Cba_ObjFinNum(p, iObj) - 1;
                int Slice  = nBits / nParts;
                int nFins = Cba_ObjFinNum(p, iObj);
                assert( Cba_ObjFinNum(p, iObj) >= 2 );
                assert( Slice * nParts == nBits );
                assert( nFins == 1 + nParts );
                Cba_ObjCleanFinFon( p, iObj, 1 );
                // create buffer for the constant
                if ( FonCat < 0 ) 
                {
                    int iObjNew = Cba_ObjAlloc( p, CBA_BOX_BUF, 1, 1 );
                    Cba_ObjSetFinFon( p, iObjNew, 0, FonCat );
                    FonCat = Cba_ObjFon0( p, iObjNew );
                    NameId = Cba_NtkNewStrId( p, "_buf_const_%d", iObjNew );
                    Cba_FonSetName( p, FonCat, NameId );
                    Cba_FonSetRange( p, FonCat, Cba_NtkHashRange(p, nBits-1, 0) );
                }
                for ( k = 0; k < nParts; k++ )
                {
//                    iFon = Prs_CreateSlice( p, FonCat, pNtk, Cba_NtkHashRange(p, (nParts-1-k)*Slice+Slice-1, (nParts-1-k)*Slice) );
                    iFon = Prs_CreateSlice( p, FonCat, pNtk, Cba_NtkHashRange(p, k*Slice+Slice-1, k*Slice) );
                    Cba_ObjSetFinFon( p, iObj, k+1, iFon );
                }
            }
        }
        // if carry-in is not supplied, use constant 0
        if ( Type == CBA_BOX_ADD && Cba_ObjFinFon(p, iObj, 0) == 0 )
            Cba_ObjSetFinFon( p, iObj, 0, Cba_FonFromConst(1) );
        // if set or reset are not supplied, use constant 0
        if ( Type == CBA_BOX_DFFRS && Cba_ObjFinFon(p, iObj, 1) == 0 )
            Cba_ObjSetFinFon( p, iObj, 1, Cba_FonFromConst(1) );
        if ( Type == CBA_BOX_DFFRS && Cba_ObjFinFon(p, iObj, 2) == 0 )
            Cba_ObjSetFinFon( p, iObj, 2, Cba_FonFromConst(1) );
    }
    Vec_IntFree( vBox2Obj );
    // connect outputs
    Vec_IntForEachEntryTwo( &pNtk->vOutputs, &pNtk->vOutputsR, NameId, RangeId, i )
    {
        iObj = Cba_NtkPo( p, i );
        assert( NameId == Cba_ObjName(p, iObj) ); // direct name
        iFon = Prs_CreateVerilogFindFon( p, NameId );
        if ( !iFon ) 
            continue;
        Cba_ObjSetFinFon( p, iObj, 0, iFon );
        if ( RangeId )
        {
            assert( Cba_NtkRangeLeft(p, Abc_Lit2Var(RangeId))  == Cba_FonLeft(p, iFon) );
            assert( Cba_NtkRangeRight(p, Abc_Lit2Var(RangeId)) == Cba_FonRight(p, iFon) );
        }
    }
    return 0;
}